

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::U64>
          (BinBinaryReader *this,U64 *value)

{
  ulong *puVar1;
  char **ppcVar2;
  ulong *puVar3;
  ulong *puVar4;
  bool bVar5;
  ulong uVar6;
  
  puVar3 = (ulong *)(this->reader).cur_;
  puVar4 = (ulong *)(this->reader).cap_;
  puVar1 = puVar3 + 1;
  if (puVar4 < puVar1) {
    bVar5 = fail_msg(this,"reader.read(value.value)",(this->reader).cur_);
    uVar6 = (ulong)bVar5;
  }
  else {
    uVar6 = *puVar3;
    value->value = uVar6;
    ppcVar2 = &(this->reader).cur_;
    *ppcVar2 = *ppcVar2 + 8;
  }
  return (bool)(puVar1 <= puVar4 | (byte)uVar6 & 1);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }